

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O2

iterator * __thiscall
linq::IEnumerableCore<linq::IEnumerable<int_&>_>::begin
          (iterator *__return_storage_ptr__,IEnumerableCore<linq::IEnumerable<int_&>_> *this)

{
  IEnumerable<int_&> IStack_28;
  
  IEnumerable<int_&>::IEnumerable(&IStack_28,&this->source);
  iterator::iterator(__return_storage_ptr__,&IStack_28,true);
  IEnumerable<int_&>::~IEnumerable(&IStack_28);
  return __return_storage_ptr__;
}

Assistant:

iterator begin() { return iterator(source); }